

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O0

int Fl::screen_num(int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  float fVar3;
  int local_34;
  float sintersection;
  int sh;
  int sw;
  int sy;
  int sx;
  int i;
  float best_intersection;
  int best_screen;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  i = 0;
  sx = 0;
  sy = 0;
  best_intersection = (float)h;
  best_screen = w;
  h_local = y;
  w_local = x;
  while( true ) {
    iVar1 = sy;
    iVar2 = screen_count();
    if (iVar2 <= iVar1) break;
    sw = 0;
    sh = 0;
    sintersection = 0.0;
    local_34 = 0;
    screen_xywh(&sw,&sh,(int *)&sintersection,&local_34,sy);
    fVar3 = fl_intersection(w_local,h_local,best_screen,(int)best_intersection,sw,sh,
                            (int)sintersection,local_34);
    if ((float)sx < fVar3) {
      i = sy;
      sx = (int)fVar3;
    }
    sy = sy + 1;
  }
  return i;
}

Assistant:

int Fl::screen_num(int x, int y, int w, int h) {
  int best_screen = 0;
  float best_intersection = 0.;
  for (int i = 0; i < Fl::screen_count(); i++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    float sintersection = fl_intersection(x, y, w, h, sx, sy, sw, sh);
    if (sintersection > best_intersection) {
      best_screen = i;
      best_intersection = sintersection;
    }
  }
  return best_screen;
}